

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageBase.cpp
# Opt level: O0

vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> * __thiscall
myvk::ImageBase::GetDstMemoryBarriers
          (ImageBase *this,vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_> *regions,
          VkAccessFlags src_access_mask,VkAccessFlags dst_access_mask,VkImageLayout old_layout,
          VkImageLayout new_layout,uint32_t src_queue_family,uint32_t dst_queue_family)

{
  size_type sVar1;
  reference pvVar2;
  const_reference pvVar3;
  VkAccessFlags in_ECX;
  vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_> *in_RDX;
  long in_RSI;
  allocator_type *in_RDI;
  VkAccessFlags in_R8D;
  VkImageLayout in_R9D;
  VkImageLayout in_stack_00000008;
  uint32_t in_stack_00000010;
  uint32_t in_stack_00000018;
  VkImageSubresourceRange *range;
  VkImageMemoryBarrier *cur;
  uint32_t i;
  vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *barriers;
  allocator_type *__a;
  vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *this_00;
  uint local_38;
  vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> local_26;
  
  local_26.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>._M_impl.
  super__Vector_impl_data._M_start._1_1_ = 0;
  __a = in_RDI;
  local_26.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>._M_impl.
  super__Vector_impl_data._M_start._2_4_ = in_R9D;
  local_26.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>._M_impl.
  super__Vector_impl_data._6_4_ = in_R8D;
  local_26.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>._M_impl.
  super__Vector_impl_data._M_finish._2_4_ = in_ECX;
  local_26.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>._M_impl.
  super__Vector_impl_data._14_8_ = in_RDX;
  sVar1 = std::vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>::size(in_RDX);
  this_00 = &local_26;
  std::allocator<VkImageMemoryBarrier>::allocator((allocator<VkImageMemoryBarrier> *)0x2a6190);
  std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::vector
            (this_00,sVar1,__a);
  std::allocator<VkImageMemoryBarrier>::~allocator((allocator<VkImageMemoryBarrier> *)&local_26);
  for (local_38 = 0;
      sVar1 = std::vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>::size
                        ((vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_> *)
                         local_26.
                         super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                         ._M_impl.super__Vector_impl_data._14_8_), local_38 < sVar1;
      local_38 = local_38 + 1) {
    pvVar2 = std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::operator[]
                       ((vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)__a,
                        (ulong)local_38);
    pvVar2->sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
    pvVar2->image = *(VkImage *)(in_RSI + 0x18);
    pvVar2->oldLayout =
         local_26.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
         _M_impl.super__Vector_impl_data._M_start._2_4_;
    pvVar2->newLayout = in_stack_00000008;
    pvVar2->srcAccessMask =
         local_26.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
         _M_impl.super__Vector_impl_data._M_finish._2_4_;
    pvVar2->dstAccessMask =
         local_26.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
         _M_impl.super__Vector_impl_data._6_4_;
    pvVar2->srcQueueFamilyIndex = in_stack_00000010;
    pvVar2->dstQueueFamilyIndex = in_stack_00000018;
    pvVar3 = std::vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>::operator[]
                       ((vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_> *)
                        local_26.
                        super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                        ._M_impl.super__Vector_impl_data._14_8_,(ulong)local_38);
    (pvVar2->subresourceRange).aspectMask = (pvVar3->imageSubresource).aspectMask;
    pvVar3 = std::vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>::operator[]
                       ((vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_> *)
                        local_26.
                        super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                        ._M_impl.super__Vector_impl_data._14_8_,(ulong)local_38);
    (pvVar2->subresourceRange).baseMipLevel = (pvVar3->imageSubresource).mipLevel;
    (pvVar2->subresourceRange).levelCount = 1;
    pvVar3 = std::vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>::operator[]
                       ((vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_> *)
                        local_26.
                        super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                        ._M_impl.super__Vector_impl_data._14_8_,(ulong)local_38);
    (pvVar2->subresourceRange).baseArrayLayer = (pvVar3->imageSubresource).baseArrayLayer;
    pvVar3 = std::vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>::operator[]
                       ((vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_> *)
                        local_26.
                        super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                        ._M_impl.super__Vector_impl_data._14_8_,(ulong)local_38);
    (pvVar2->subresourceRange).layerCount = (pvVar3->imageSubresource).layerCount;
  }
  return (vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)in_RDI;
}

Assistant:

std::vector<VkImageMemoryBarrier>
ImageBase::GetDstMemoryBarriers(const std::vector<VkBufferImageCopy> &regions, VkAccessFlags src_access_mask,
                                VkAccessFlags dst_access_mask, VkImageLayout old_layout, VkImageLayout new_layout,
                                uint32_t src_queue_family, uint32_t dst_queue_family) const {
	std::vector<VkImageMemoryBarrier> barriers(regions.size());

	for (uint32_t i = 0; i < regions.size(); ++i) {
		VkImageMemoryBarrier &cur = barriers[i];
		cur.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
		cur.image = m_image;
		cur.oldLayout = old_layout;
		cur.newLayout = new_layout;
		cur.srcAccessMask = src_access_mask;
		cur.dstAccessMask = dst_access_mask;
		cur.srcQueueFamilyIndex = src_queue_family;
		cur.dstQueueFamilyIndex = dst_queue_family;
		VkImageSubresourceRange &range = cur.subresourceRange;
		range.aspectMask = regions[i].imageSubresource.aspectMask;
		range.baseMipLevel = regions[i].imageSubresource.mipLevel;
		range.levelCount = 1;
		range.baseArrayLayer = regions[i].imageSubresource.baseArrayLayer;
		range.layerCount = regions[i].imageSubresource.layerCount;
	}
	return barriers;
}